

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void BinarySink_put_mp_ssh1(BinarySink *bs,mp_int *x)

{
  BinarySink *bs_00;
  uint8_t val;
  size_t val_00;
  ulong local_30;
  size_t i;
  size_t bytes;
  size_t bits;
  mp_int *x_local;
  BinarySink *bs_local;
  
  val_00 = mp_get_nbits(x);
  if (val_00 < 0x10000) {
    BinarySink_put_uint16(bs->binarysink_,val_00);
    local_30 = val_00 + 7 >> 3;
    while (local_30 != 0) {
      bs_00 = bs->binarysink_;
      val = mp_get_byte(x,local_30 - 1);
      BinarySink_put_byte(bs_00,val);
      local_30 = local_30 - 1;
    }
    return;
  }
  __assert_fail("bits < 0x10000",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x25a,"void BinarySink_put_mp_ssh1(BinarySink *, mp_int *)");
}

Assistant:

void BinarySink_put_mp_ssh1(BinarySink *bs, mp_int *x)
{
    size_t bits = mp_get_nbits(x);
    size_t bytes = (bits + 7) / 8;

    assert(bits < 0x10000);
    put_uint16(bs, bits);
    for (size_t i = bytes; i-- > 0 ;)
        put_byte(bs, mp_get_byte(x, i));
}